

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

CommandLineArguments * __thiscall
adios2sys::Encoding::CommandLineArguments::operator=
          (CommandLineArguments *this,CommandLineArguments *other)

{
  size_type sVar1;
  reference ppcVar2;
  size_type sVar3;
  const_reference ppcVar4;
  CommandLineArguments *in_RSI;
  CommandLineArguments *in_RDI;
  size_t i;
  char *local_38;
  size_type local_18;
  
  if (in_RDI != in_RSI) {
    local_18 = 0;
    while (sVar3 = local_18,
          sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&in_RDI->argv_), sVar3 < sVar1)
    {
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&in_RDI->argv_,local_18);
      free(*ppcVar2);
      local_18 = local_18 + 1;
    }
    std::vector<char_*,_std::allocator<char_*>_>::size(&in_RSI->argv_);
    std::vector<char_*,_std::allocator<char_*>_>::resize(&in_RDI->argv_,sVar3);
    for (local_18 = 0; sVar3 = std::vector<char_*,_std::allocator<char_*>_>::size(&in_RDI->argv_),
        local_18 < sVar3; local_18 = local_18 + 1) {
      ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&in_RSI->argv_,local_18);
      if (*ppcVar4 == (value_type)0x0) {
        local_38 = (char *)0x0;
      }
      else {
        ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&in_RSI->argv_,local_18);
        local_38 = strdup(*ppcVar4);
      }
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&in_RDI->argv_,local_18);
      *ppcVar2 = local_38;
    }
  }
  return in_RDI;
}

Assistant:

Encoding::CommandLineArguments& Encoding::CommandLineArguments::operator=(
  const CommandLineArguments& other)
{
  if (this != &other) {
    size_t i;
    for (i = 0; i < this->argv_.size(); i++) {
      free(this->argv_[i]);
    }

    this->argv_.resize(other.argv_.size());
    for (i = 0; i < this->argv_.size(); i++) {
      this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : nullptr;
    }
  }

  return *this;
}